

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O2

void y4m_convert_444_420jpeg(y4m_input *_y4m,uchar *_dst,uchar *_aux)

{
  int iVar1;
  int _c_h;
  int iVar2;
  int iVar3;
  int iVar4;
  uchar uVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int _c_w;
  uchar *puVar11;
  int iVar12;
  uchar *_dst_00;
  int iVar13;
  long lVar14;
  uchar *_src;
  int iVar15;
  int iVar16;
  
  iVar1 = _y4m->pic_w;
  _c_h = _y4m->pic_h;
  _dst_00 = _dst + _c_h * iVar1;
  iVar13 = (iVar1 + _y4m->src_c_dec_h + -1) / _y4m->src_c_dec_h;
  _c_w = (iVar1 + _y4m->dst_c_dec_h + -1) / _y4m->dst_c_dec_h;
  iVar1 = _y4m->dst_c_dec_v;
  _src = _aux + _c_h * iVar13 * 2;
  lVar14 = (long)iVar13;
  iVar15 = (int)(lVar14 + -1);
  iVar12 = 1;
  iVar8 = 1;
  if (iVar15 < 1) {
    iVar8 = iVar15;
  }
  iVar2 = 2;
  if (iVar15 < 2) {
    iVar2 = iVar15;
  }
  iVar3 = 3;
  if (iVar15 < 3) {
    iVar3 = iVar15;
  }
  iVar16 = 0;
  if (0 < _c_h) {
    iVar16 = _c_h;
  }
  for (; iVar12 != 3; iVar12 = iVar12 + 1) {
    for (iVar4 = 0; iVar4 != iVar16; iVar4 = iVar4 + 1) {
      if (iVar13 < 1) {
        uVar10 = 0;
      }
      else {
        iVar6 = (int)((uint)_aux[iVar2] * -0x11 + (uint)_aux[iVar8] * 0x4e + (uint)*_aux * 0x40 +
                      (uint)_aux[iVar3] + (uint)_aux[iVar3] * 2 + 0x40) >> 7;
        if (0xfe < iVar6) {
          iVar6 = 0xff;
        }
        uVar5 = (uchar)iVar6;
        if (iVar6 < 1) {
          uVar5 = '\0';
        }
        *_src = uVar5;
        uVar10 = 2;
      }
      uVar7 = uVar10 >> 1;
      puVar11 = _src + uVar7;
      for (; (long)uVar10 < (long)(iVar13 + -3); uVar10 = uVar10 + 2) {
        iVar6 = (int)(((uint)_aux[uVar10 + 1] + (uint)_aux[uVar10]) * 0x4e +
                      ((uint)_aux[uVar10 + 2] + (uint)_aux[uVar10 - 1]) * -0x11 +
                      ((uint)_aux[uVar10 + 3] + (uint)_aux[uVar10 - 2]) * 3 + 0x40) >> 7;
        if (0xfe < iVar6) {
          iVar6 = 0xff;
        }
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        *puVar11 = (uchar)iVar6;
        puVar11 = puVar11 + 1;
        uVar7 = uVar7 + 1;
      }
      while ((long)uVar10 < lVar14) {
        iVar9 = (int)(uVar10 + 2);
        iVar6 = iVar15;
        if (iVar9 < iVar15) {
          iVar6 = iVar9;
        }
        iVar9 = (int)uVar10 + 1;
        if (iVar15 <= iVar9) {
          iVar9 = iVar15;
        }
        iVar6 = (int)(((uint)_aux[iVar9] + (uint)_aux[uVar10]) * 0x4e +
                      ((uint)_aux[iVar6] + (uint)_aux[uVar10 - 1]) * -0x11 +
                      ((uint)_aux[lVar14 + -1] + (uint)_aux[uVar10 - 2]) * 3 + 0x40) >> 7;
        if (0xfe < iVar6) {
          iVar6 = 0xff;
        }
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        _src[(uint)uVar7 & 0x7fffffff] = (uchar)iVar6;
        uVar7 = uVar7 + 1;
        uVar10 = uVar10 + 2;
      }
      _src = _src + _c_w;
      _aux = _aux + lVar14;
    }
    _src = _src + -(long)(_c_w * _c_h);
    y4m_422jpeg_420jpeg_helper(_dst_00,_src,_c_w,_c_h);
    _dst_00 = _dst_00 + ((_c_h + iVar1 + -1) / iVar1) * _c_w;
  }
  return;
}

Assistant:

static void y4m_convert_444_420jpeg(y4m_input *_y4m, unsigned char *_dst,
                                    unsigned char *_aux) {
  unsigned char *tmp;
  int c_w;
  int c_h;
  int c_sz;
  int dst_c_w;
  int dst_c_h;
  int dst_c_sz;
  int tmp_sz;
  int pli;
  int y;
  int x;
  /*Skip past the luma data.*/
  _dst += _y4m->pic_w * _y4m->pic_h;
  /*Compute the size of each chroma plane.*/
  c_w = (_y4m->pic_w + _y4m->src_c_dec_h - 1) / _y4m->src_c_dec_h;
  c_h = _y4m->pic_h;
  dst_c_w = (_y4m->pic_w + _y4m->dst_c_dec_h - 1) / _y4m->dst_c_dec_h;
  dst_c_h = (_y4m->pic_h + _y4m->dst_c_dec_v - 1) / _y4m->dst_c_dec_v;
  c_sz = c_w * c_h;
  dst_c_sz = dst_c_w * dst_c_h;
  tmp_sz = dst_c_w * c_h;
  tmp = _aux + 2 * c_sz;
  for (pli = 1; pli < 3; pli++) {
    /*Filter: [3 -17 78 78 -17 3]/128, derived from a 6-tap Lanczos window.*/
    for (y = 0; y < c_h; y++) {
      for (x = 0; x < OC_MINI(c_w, 2); x += 2) {
        tmp[x >> 1] = OC_CLAMPI(0,
                                (64 * _aux[0] + 78 * _aux[OC_MINI(1, c_w - 1)] -
                                 17 * _aux[OC_MINI(2, c_w - 1)] +
                                 3 * _aux[OC_MINI(3, c_w - 1)] + 64) >>
                                    7,
                                255);
      }
      for (; x < c_w - 3; x += 2) {
        tmp[x >> 1] = OC_CLAMPI(0,
                                (3 * (_aux[x - 2] + _aux[x + 3]) -
                                 17 * (_aux[x - 1] + _aux[x + 2]) +
                                 78 * (_aux[x] + _aux[x + 1]) + 64) >>
                                    7,
                                255);
      }
      for (; x < c_w; x += 2) {
        tmp[x >> 1] =
            OC_CLAMPI(0,
                      (3 * (_aux[x - 2] + _aux[c_w - 1]) -
                       17 * (_aux[x - 1] + _aux[OC_MINI(x + 2, c_w - 1)]) +
                       78 * (_aux[x] + _aux[OC_MINI(x + 1, c_w - 1)]) + 64) >>
                          7,
                      255);
      }
      tmp += dst_c_w;
      _aux += c_w;
    }
    tmp -= tmp_sz;
    /*Now do the vertical filtering.*/
    y4m_422jpeg_420jpeg_helper(_dst, tmp, dst_c_w, c_h);
    _dst += dst_c_sz;
  }
}